

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_shared_expressions.cpp
# Opt level: O2

vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *
duckdb::WindowSharedExpressions::GetSortedExpressions
          (vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true>
           *__return_storage_ptr__,Shared *shared)

{
  _Hash_node_base _Var1;
  _Hash_node_base _Var2;
  reference pvVar3;
  _Hash_node_base *p_Var4;
  __node_base *p_Var5;
  allocator_type local_29;
  
  ::std::
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
  ::vector(&__return_storage_ptr__->
            super_vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
           ,shared->size,&local_29);
  p_Var5 = &(shared->columns)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var5[1]._M_nxt;
    _Var2._M_nxt = p_Var5[3]._M_nxt;
    for (p_Var4 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
        p_Var4 != _Var2._M_nxt; p_Var4 = p_Var4 + 1) {
      pvVar3 = vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true>::get<true>
                         (__return_storage_ptr__,(size_type)p_Var4->_M_nxt);
      pvVar3->ptr = (Expression *)_Var1._M_nxt;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<optional_ptr<const Expression>> WindowSharedExpressions::GetSortedExpressions(Shared &shared) {
	vector<optional_ptr<const Expression>> sorted(shared.size);
	for (auto &col : shared.columns) {
		auto &expr = col.first.get();
		for (auto col_idx : col.second) {
			sorted[col_idx] = &expr;
		}
	}

	return sorted;
}